

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  bool local_3b15;
  undefined1 local_3b10 [3];
  bool quit;
  int videoPitch;
  undefined1 local_3af0 [8];
  Chip8 chip8;
  Platform platform;
  int scale;
  undefined1 local_40 [8];
  string rom;
  uint VIDEO_WIDTH;
  uint VIDEO_HEIGHT;
  char **argv_local;
  int argc_local;
  
  rom.field_2._12_4_ = 0x20;
  rom.field_2._8_4_ = 0x40;
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter ROM file path: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)local_40);
  std::operator>>((istream *)&std::cin,(string *)local_40);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter scale: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,(int *)&platform.texture);
  Platform::Platform((Platform *)&chip8.field_0x3a80,"CHIP8 Interpreter",(int)platform.texture << 6,
                     (int)platform.texture << 5,0x40,0x20);
  Chip8::Chip8((Chip8 *)local_3af0);
  std::__cxx11::string::string
            ((string *)local_3b10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  Chip8::LoadGame((Chip8 *)local_3af0,(string *)local_3b10);
  std::__cxx11::string::~string((string *)local_3b10);
  local_3b15 = false;
  while (((local_3b15 ^ 0xffU) & 1) != 0) {
    local_3b15 = Platform::ProcessInput((Platform *)&chip8.field_0x3a80,local_3af0);
    Chip8::emulate((Chip8 *)local_3af0);
    Platform::Update((Platform *)&chip8.field_0x3a80,chip8.keys + 8,0x100);
  }
  Platform::~Platform((Platform *)&chip8.field_0x3a80);
  std::__cxx11::string::~string((string *)local_40);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    const unsigned int VIDEO_HEIGHT = 32;
    const unsigned int VIDEO_WIDTH = 64;

    std::cout << "Enter ROM file path: " << std::endl;
    std::string rom;
	std::cin >> rom;

    int scale;
    std::cout << "Enter scale: " << std::endl;
    std::cin >> scale;



	Platform platform("CHIP8 Interpreter", VIDEO_WIDTH * scale, VIDEO_HEIGHT * scale, VIDEO_WIDTH, VIDEO_HEIGHT);

	Chip8 chip8;
	chip8.LoadGame(rom);

	int videoPitch = sizeof(chip8.display[0]) * VIDEO_WIDTH;

	bool quit = false;

	while (!quit)
	{
		quit = platform.ProcessInput(chip8.keys);

			chip8.emulate();
			platform.Update(chip8.display, videoPitch);

	}

	return 0;
}